

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O0

void objc_send_initialize(id object)

{
  BOOL BVar1;
  dtable_t pSVar2;
  undefined8 *local_d0;
  SparseArray *local_b8;
  undefined1 local_a0 [8];
  InitializingDtable meta_buffer;
  InitializingDtable buffer;
  objc_method *initializeSlot;
  dtable_t dtable;
  dtable_t class_dtable;
  BOOL skipMeta;
  id local_40;
  id lock_object_pointer;
  Class meta;
  Class class;
  id object_local;
  uintptr_t addr;
  Class local_10;
  
  class = (Class)object;
  addr = (uintptr_t)object;
  BVar1 = isSmallObject(object);
  if (BVar1 == '\0') {
    local_10 = *(Class *)addr;
  }
  else {
    object_local = (id)addr;
    local_10 = SmallObjectClasses[addr & 7];
  }
  meta = local_10;
  BVar1 = objc_test_class_flag(local_10,objc_class_flag_meta);
  if (BVar1 != '\0') {
    meta = class;
  }
  lock_object_pointer = (id)meta->isa;
  objc_resolve_class(meta);
  if (meta->super_class != (Class)0x0) {
    objc_send_initialize((id)meta->super_class);
  }
  pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
  BVar1 = objc_test_class_flag(meta,objc_class_flag_initialized);
  if (BVar1 == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
    local_40 = lock_object_pointer;
    objc_sync_enter((id_conflict)lock_object_pointer);
    pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
    pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
    BVar1 = objc_test_class_flag(meta,objc_class_flag_initialized);
    if (BVar1 == '\0') {
      BVar1 = objc_test_class_flag((Class)lock_object_pointer,objc_class_flag_initialized);
      if (BVar1 == '\0') {
        objc_set_class_flag((Class)lock_object_pointer,objc_class_flag_permanent_instances);
      }
      objc_set_class_flag(meta,objc_class_flag_initialized);
      objc_set_class_flag((Class)lock_object_pointer,objc_class_flag_initialized);
      pSVar2 = create_dtable_for_class(meta,uninstalled_dtable);
      if (BVar1 == '\0') {
        local_b8 = create_dtable_for_class((Class)lock_object_pointer,pSVar2);
      }
      else {
        local_b8 = (SparseArray *)0x0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
      if (objc_send_initialize::initializeSel == (SEL)0x0) {
        objc_send_initialize::initializeSel = sel_registerName("initialize");
      }
      if (BVar1 == '\0') {
        local_d0 = (undefined8 *)
                   SparseArrayLookup(local_b8,*(uint32_t *)
                                               &objc_send_initialize::initializeSel->field_0);
      }
      else {
        local_d0 = (undefined8 *)0x0;
      }
      if (local_d0 == (undefined8 *)0x0) {
        if (BVar1 == '\0') {
          lock_object_pointer[8].isa = (Class)local_b8;
        }
        meta->dtable = pSVar2;
        checkARCAccessors(meta);
        pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      }
      else {
        meta_buffer.next = (_InitializingDtable *)meta;
        local_a0 = (undefined1  [8])lock_object_pointer;
        meta_buffer.class = (Class)local_b8;
        meta_buffer.dtable = (dtable_t)&meta_buffer.next;
        temporary_dtables = (InitializingDtable *)local_a0;
        pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
        checkARCAccessors(meta);
        (*(code *)*local_d0)(meta,objc_send_initialize::initializeSel);
        remove_dtable((InitializingDtable *)local_a0);
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
    }
    objc_release_object_lock(&local_40);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
    objc_sync_enter((id_conflict)lock_object_pointer);
    objc_sync_exit((id_conflict)lock_object_pointer);
    pSVar2 = dtable_for_class(meta);
    if (pSVar2 == uninstalled_dtable) {
      __assert_fail("dtable_for_class(class) != uninstalled_dtable",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/dtable.c",
                    0x301,"void objc_send_initialize(id)");
    }
  }
  return;
}

Assistant:

OBJC_PUBLIC void objc_send_initialize(id object)
{
	Class class = classForObject(object);
	// If the first message is sent to an instance (weird, but possible and
	// likely for things like NSConstantString, make sure +initialize goes to
	// the class not the metaclass.  
	if (objc_test_class_flag(class, objc_class_flag_meta))
	{
		class = (Class)object;
	}
	Class meta = class->isa;


	// Make sure that the class is resolved.
	objc_resolve_class(class);

	// Make sure that the superclass is initialized first.
	if (Nil != class->super_class)
	{
		objc_send_initialize((id)class->super_class);
	}

	// Lock the runtime while we're creating dtables and before we acquire the
	// init lock.  This prevents a lock-order reversal when dtable_for_class is
	// called from something holding the runtime lock while we're still holding
	// the initialize lock.  We should ensure that we never acquire the runtime
	// lock after acquiring the initialize lock.
	LOCK_RUNTIME();

	// Superclass +initialize might possibly send a message to this class, in
	// which case this method would be called again.  See NSObject and
	// NSAutoreleasePool +initialize interaction in GNUstep.
	if (objc_test_class_flag(class, objc_class_flag_initialized))
	{
		// We know that initialization has started because the flag is set.
		// Check that it's finished by grabbing the class lock.  This will be
		// released once the class has been fully initialized. The runtime
		// lock needs to be released first to prevent a deadlock between the
		// runtime lock and the class-specific lock.
		UNLOCK_RUNTIME();

		objc_sync_enter((id)meta);
		objc_sync_exit((id)meta);
		assert(dtable_for_class(class) != uninstalled_dtable);
		return;
	}

	// We should try to acquire the class lock before any runtime/init locks.
	// If another thread is in the middle of running `allocateHiddenClass()` it 
	// has acquired a spinlock and will be trying to acquire the runtime lock. 
	// When this happens there is a small chance we could hit the same spinlock
	// and deadlock the process (as any further attempts to acquire the runtime 
	// will also block forever).
	UNLOCK_RUNTIME();

	LOCK_OBJECT_FOR_SCOPE((id)meta);
	LOCK_RUNTIME();
	LOCK(&initialize_lock);
	if (objc_test_class_flag(class, objc_class_flag_initialized))
	{
		UNLOCK(&initialize_lock);
		UNLOCK_RUNTIME();
		return;
	}
	BOOL skipMeta = objc_test_class_flag(meta, objc_class_flag_initialized);
	// Mark metaclasses as never needing refcount manipulation for their
	// instances (classes).
	if (!skipMeta)
	{
		objc_set_class_flag(meta, objc_class_flag_permanent_instances);
	}

	// Set the initialized flag on both this class and its metaclass, to make
	// sure that +initialize is only ever sent once.
	objc_set_class_flag(class, objc_class_flag_initialized);
	objc_set_class_flag(meta, objc_class_flag_initialized);

	dtable_t class_dtable = create_dtable_for_class(class, uninstalled_dtable);
	dtable_t dtable = skipMeta ? 0 : create_dtable_for_class(meta, class_dtable);
	// Now we've finished doing things that may acquire the runtime lock, so we
	// can hold onto the initialise lock to make anything doing
	// dtable_for_class block until we've finished updating temporary dtable
	// lists.
	// If another thread holds the runtime lock, it can now proceed until it
	// gets into a dtable_for_class call, and then block there waiting for us
	// to finish setting up the temporary dtable.
	UNLOCK_RUNTIME();

	static SEL initializeSel = 0;
	if (0 == initializeSel)
	{
		initializeSel = sel_registerName("initialize");
	}

	struct objc_method *initializeSlot = skipMeta ? 0 :
			objc_dtable_lookup(dtable, initializeSel->index);

	// If there's no initialize method, then don't bother installing and
	// removing the initialize dtable, just install both dtables correctly now
	if (0 == initializeSlot)
	{
		if (!skipMeta)
		{
			meta->dtable = dtable;
		}
		class->dtable = class_dtable;
		checkARCAccessors(class);
		UNLOCK(&initialize_lock);
		return;
	}



	// Create an entry in the dtable look-aside buffer for this.  When sending
	// a message to this class in future, the lookup function will check this
	// buffer if the receiver's dtable is not installed, and block if
	// attempting to send a message to this class.
	InitializingDtable buffer = { class, class_dtable, temporary_dtables };
	__attribute__((cleanup(remove_dtable)))
	InitializingDtable meta_buffer = { meta, dtable, &buffer };
	temporary_dtables = &meta_buffer;
	// We now release the initialize lock.  We'll reacquire it later when we do
	// the cleanup, but at this point we allow other threads to get the
	// temporary dtable and call +initialize in other threads.
	UNLOCK(&initialize_lock);
	// We still hold the class lock at this point.  dtable_for_class will block
	// there after acquiring the temporary dtable.

	checkARCAccessors(class);

	// Store the buffer in the temporary dtables list.  Note that it is safe to
	// insert it into a global list, even though it's a temporary variable,
	// because we will clean it up after this function.
	initializeSlot->imp((id)class, initializeSel);
}